

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O3

ScopeInfo *
Js::ScopeInfo::SaveOneScopeInfo
          (ByteCodeGenerator *byteCodeGenerator,Scope *scope,ScriptContext *scriptContext)

{
  int32 right;
  FunctionInfo *pFVar1;
  Symbol *pSVar2;
  code *pcVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  bool bVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  BOOL BVar11;
  undefined4 *puVar12;
  Recycler *this;
  ScopeInfo *this_00;
  ushort uVar13;
  ushort uVar14;
  char16_t *pcVar15;
  size_t size;
  ushort uVar16;
  long lVar17;
  Symbol *sym;
  undefined1 local_70 [8];
  MapSymbolData mapSymbolData;
  uint local_34 [2];
  int count;
  
  if (scope->scopeInfo != (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3a,"(scope->GetScopeInfo() == nullptr)",
                                "scope->GetScopeInfo() == nullptr");
    if (!bVar7) goto LAB_008a2e66;
    *puVar12 = 0;
  }
  if (scope->scopeType == ScopeType_Global) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3b,"(scope->GetScopeType() != ScopeType_Global)",
                                "scope->GetScopeType() != ScopeType_Global");
    if (!bVar7) goto LAB_008a2e66;
    *puVar12 = 0;
  }
  local_34[0] = scope->m_count;
  right = scope->func->argsPlaceHolderSlotCount;
  if ((right != 0) && (bVar7 = Int32Math::Add(local_34[0],right,(int32 *)local_34), bVar7)) {
    ::Math::DefaultOverflowPolicy();
  }
  mapSymbolData.byteCodeGenerator = (ByteCodeGenerator *)((long)(int)local_34[0] << 4);
  local_70 = (undefined1  [8])&typeinfo;
  mapSymbolData.func = (FuncInfo *)&DAT_ffffffffffffffff;
  mapSymbolData._16_8_ = anon_var_dwarf_3a7f2f7;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
  lVar17 = (long)(int)local_34[0];
  BVar11 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar7) goto LAB_008a2e66;
    *puVar12 = 0;
  }
  size = 0xffffffffffffffff;
  if ((ulong)(lVar17 * 0x10) < 0xffffffffffffffd0) {
    size = lVar17 * 0x10 + 0x30;
  }
  this_00 = (ScopeInfo *)
            Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>(this,size);
  if (this_00 == (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar7) {
LAB_008a2e66:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  uVar6 = local_34[0];
  pFVar1 = (scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr;
  uVar16 = 0;
  (this_00->parent).ptr = (ScopeInfo *)0x0;
  Memory::Recycler::WBSetBit((char *)&this_00->functionInfo);
  (this_00->functionInfo).ptr = pFVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->functionInfo);
  *(ushort *)&this_00->field_0x10 = *(ushort *)&this_00->field_0x10 & 0xfe0f;
  this_00->scope = (Type)0x0;
  this_00->symbolCount = uVar6;
  this_00->scopeType = scope->scopeType;
  uVar8 = *(ushort *)&scope->field_0x44 & 1;
  uVar4 = (ushort)*(undefined4 *)&this_00->field_0x10;
  *(ushort *)&this_00->field_0x10 = uVar4 & 0xfffe | uVar8;
  uVar9 = *(ushort *)&scope->field_0x44 & 2;
  *(ushort *)&this_00->field_0x10 = uVar4 & 0xfffc | uVar8 | uVar9;
  uVar10 = *(ushort *)&scope->field_0x44 >> 2 & 4;
  *(ushort *)&this_00->field_0x10 = uVar4 & 0xfff8 | uVar8 | uVar9 | uVar10;
  if (scope->func->bodyScope == scope) {
    uVar16 = *(ushort *)&scope->func->field_0xb4 >> 5 & 8;
  }
  *(ushort *)&this_00->field_0x10 = uVar16 | uVar4 & 0xfff0 | uVar8 | uVar9 | uVar10;
  uVar13 = *(ushort *)&scope->field_0x44 >> 3 & 0x20;
  *(ushort *)&this_00->field_0x10 = uVar16 | uVar4 & 0xffd0 | uVar8 | uVar9 | uVar10 | uVar13;
  if (scope->scopeType == ScopeType_FunctionBody) {
    uVar14 = *(byte *)((long)&((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr
                              )->attributes + 1) & 0x40;
    *(ushort *)&this_00->field_0x10 =
         uVar16 | uVar4 & 0xff90 | uVar8 | uVar9 | uVar10 | uVar13 | uVar14;
    uVar5 = (ushort)(((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->
                     attributes >> 9) & 0x80;
    *(ushort *)&this_00->field_0x10 =
         uVar16 | uVar4 & 0xff10 | uVar8 | uVar9 | uVar10 | uVar13 | uVar14 | uVar5;
    *(ushort *)&this_00->field_0x10 =
         uVar16 | uVar4 & 0xfe10 | uVar8 | uVar9 | uVar10 | uVar13 | uVar14 | uVar5 |
         (ushort)(short)((scope->func->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->
                        attributes >> 2 & 0x100;
  }
  bVar7 = Phases::IsEnabled((Phases *)&DAT_015b6718,ByteCodePhase);
  if (bVar7) {
    pcVar15 = L"isObject";
    if ((*(ushort *)&this_00->field_0x10 & 2) == 0) {
      pcVar15 = L"";
    }
    Output::Print(L"\nSave ScopeInfo: %s #symbols: %d %s\n",scope->func->name,(ulong)local_34[0],
                  pcVar15);
  }
  mapSymbolData.byteCodeGenerator = (ByteCodeGenerator *)scope->func;
  mapSymbolData.func = (FuncInfo *)((ulong)mapSymbolData.func & 0xffffffff00000000);
  sym = scope->m_symList;
  if (sym != (Symbol *)0x0) {
    local_70 = (undefined1  [8])byteCodeGenerator;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pSVar2 = sym->next;
      if (sym->scope != scope) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar12 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                    ,0x5a,"(scope == sym->GetScope())","scope == sym->GetScope()");
        if (!bVar7) goto LAB_008a2e66;
        *puVar12 = 0;
      }
      SaveSymbolInfo(this_00,sym,(MapSymbolData *)local_70);
      sym = pSVar2;
    } while (pSVar2 != (Symbol *)0x0);
  }
  scope->scopeInfo = this_00;
  return this_00;
}

Assistant:

ScopeInfo* ScopeInfo::SaveOneScopeInfo(ByteCodeGenerator* byteCodeGenerator, Scope* scope, ScriptContext *scriptContext)
    {
        Assert(scope->GetScopeInfo() == nullptr);
        Assert(scope->GetScopeType() != ScopeType_Global);

        int count = scope->Count();

        // Add argsPlaceHolder which includes same name args and destructuring patterns on parameters
        AddSlotCount(count, scope->GetFunc()->argsPlaceHolderSlotCount);

        ScopeInfo* scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(),
            count * sizeof(SymbolInfo),
            ScopeInfo, scope->GetFunc()->byteCodeFunction->GetFunctionInfo(),/*parent ? parent->GetFunctionInfo() : nullptr,*/ count);
        scopeInfo->SetScopeType(scope->GetScopeType());
        scopeInfo->isDynamic = scope->GetIsDynamic();
        scopeInfo->isObject = scope->GetIsObject();
        scopeInfo->mustInstantiate = scope->GetMustInstantiate();
        scopeInfo->isCached = (scope->GetFunc()->GetBodyScope() == scope) && scope->GetFunc()->GetHasCachedScope();
        scopeInfo->hasLocalInClosure = scope->GetHasOwnLocalInClosure();

        if (scope->GetScopeType() == ScopeType_FunctionBody)
        {
            scopeInfo->isGeneratorFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsGenerator();
            scopeInfo->isAsyncFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsAsync();
            scopeInfo->isClassConstructor = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsClassConstructor();
        }

        TRACE_BYTECODE(_u("\nSave ScopeInfo: %s #symbols: %d %s\n"),
            scope->GetFunc()->name, count,
            scopeInfo->isObject ? _u("isObject") : _u(""));

        MapSymbolData mapSymbolData = { byteCodeGenerator, scope->GetFunc(), 0 };
        scope->ForEachSymbol([&mapSymbolData, scopeInfo, scope](Symbol * sym)
        {
            Assert(scope == sym->GetScope());
            scopeInfo->SaveSymbolInfo(sym, &mapSymbolData);
        });

        scope->SetScopeInfo(scopeInfo);

        return scopeInfo;
    }